

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O2

ParserMetadata *
slang::parsing::ParserMetadata::fromSyntax(ParserMetadata *__return_storage_ptr__,SyntaxNode *root)

{
  MetadataVisitor visitor;
  MetadataVisitor MStack_1d8;
  
  ParserMetadata(&MStack_1d8.meta);
  MStack_1d8.moduleDeclStack.
  super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .data_ = (pointer)MStack_1d8.moduleDeclStack.
                    super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                    .firstElement;
  MStack_1d8.moduleDeclStack.
  super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .len = 0;
  MStack_1d8.moduleDeclStack.
  super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  .cap = 4;
  MStack_1d8.defaultNetType = Unknown;
  MStack_1d8.unconnectedDrive = Unknown;
  MStack_1d8.cellDefine = false;
  MStack_1d8.timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = false;
  slang::syntax::detail::
  visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
            (root,&MStack_1d8);
  ParserMetadata(__return_storage_ptr__,&MStack_1d8.meta);
  anon_unknown_4::MetadataVisitor::~MetadataVisitor(&MStack_1d8);
  return __return_storage_ptr__;
}

Assistant:

ParserMetadata ParserMetadata::fromSyntax(const SyntaxNode& root) {
    MetadataVisitor visitor;
    root.visit(visitor);
    return visitor.meta;
}